

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger class_getfuncinfos(HSQUIRRELVM v)

{
  SQObjectPtr *o_00;
  SQObjectPtr o;
  SQObjectPtr *in_stack_00000308;
  HSQUIRRELVM in_stack_00000310;
  SQInteger in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  SQObjectPtr local_18;
  
  o_00 = stack_get(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SQObjectPtr::SQObjectPtr(&local_18,o_00);
  if ((local_18.super_SQObject._unVal.pClass)->_metamethods[0xb].super_SQObject._type == OT_NULL) {
    sq_pushnull((HSQUIRRELVM)0x12d014);
  }
  else {
    closure_getfuncinfos_obj(in_stack_00000310,in_stack_00000308);
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffe0);
  return 1;
}

Assistant:

static SQInteger class_getfuncinfos(HSQUIRRELVM v)
{
  SQObjectPtr o = stack_get(v, 1);

  if (!sq_isnull(_class(o)->_metamethods[MT_CALL]))
    closure_getfuncinfos_obj(v, _class(o)->_metamethods[MT_CALL]);
  else
    sq_pushnull(v);

  return 1;
}